

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

gguf_context * gguf_init_from_file_impl(FILE *file,gguf_init_params params)

{
  pointer pgVar1;
  iterator __position;
  undefined1 auVar2 [16];
  ggml_init_params params_00;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  gguf_context *pgVar8;
  size_t sVar9;
  ulong uVar10;
  int64_t iVar11;
  size_t sVar12;
  size_t sVar13;
  ggml_tensor *pgVar14;
  gguf_reader in_RCX;
  gguf_reader gVar15;
  pointer pgVar16;
  ggml_context **ppgVar17;
  FILE *extraout_RDX;
  char *pcVar18;
  FILE *extraout_RDX_00;
  FILE *extraout_RDX_01;
  FILE *extraout_RDX_02;
  FILE *extraout_RDX_03;
  FILE *extraout_RDX_04;
  FILE *extraout_RDX_05;
  FILE *extraout_RDX_06;
  FILE *extraout_RDX_07;
  FILE *extraout_RDX_08;
  FILE *extraout_RDX_09;
  FILE *extraout_RDX_10;
  FILE *extraout_RDX_11;
  FILE *extraout_RDX_12;
  FILE *extraout_RDX_13;
  FILE *extraout_RDX_14;
  undefined1 *__buf;
  undefined1 *extraout_RDX_15;
  undefined1 *extraout_RDX_16;
  undefined1 *extraout_RDX_17;
  undefined1 *extraout_RDX_18;
  undefined1 *extraout_RDX_19;
  undefined1 *extraout_RDX_20;
  undefined1 *extraout_RDX_21;
  undefined1 *extraout_RDX_22;
  undefined1 *extraout_RDX_23;
  undefined1 *extraout_RDX_24;
  undefined1 *extraout_RDX_25;
  undefined1 *extraout_RDX_26;
  undefined1 *extraout_RDX_27;
  undefined1 *extraout_RDX_28;
  FILE *extraout_RDX_29;
  long lVar19;
  FILE *pFVar20;
  byte bVar21;
  char *__s2;
  long *__ptr;
  long lVar22;
  FILE *pFVar23;
  ulong uVar24;
  bool bVar25;
  gguf_reader gr;
  uint64_t n;
  int64_t n_tensors;
  int64_t n_kv;
  vector<char,_std::allocator<char>_> magic;
  gguf_reader local_210;
  FILE *local_208;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar26;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar27;
  ulong in_stack_fffffffffffffe10;
  ulong uVar28;
  char local_1e8;
  undefined7 uStack_1e7;
  gguf_context *local_1d8;
  uint local_1cc;
  FILE *local_1c8;
  FILE *local_1c0;
  ggml_tensor *local_1b8;
  ggml_context **local_1b0;
  undefined1 local_1a8 [24];
  char *local_190;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  size_t local_178;
  size_t local_170;
  size_t asStack_168 [24];
  _IO_marker *local_48;
  _IO_FILE *p_Stack_40;
  byte local_38;
  
  ppgVar17 = params.ctx;
  uVar26 = params._0_4_;
  local_210.file = file;
  local_1b8 = (ggml_tensor *)file;
  pgVar8 = (gguf_context *)operator_new(0x58);
  pgVar8->version = 3;
  (pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (pgVar8->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pgVar8->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pgVar8->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pgVar8->alignment = 0x20;
  pgVar8->offset = 0;
  pgVar8->size = 0;
  pgVar8->data = (void *)0x0;
  local_1a8._16_8_ = (pointer)0x0;
  local_1a8._0_8_ = (FILE *)0x0;
  local_1a8._8_8_ = (FILE *)0x0;
  bVar5 = gguf_reader::read<char>(&local_210,(vector<char,_std::allocator<char>_> *)local_1a8,4);
  if (bVar5) {
    pcVar18 = (char *)extraout_RDX;
    if (local_1a8._8_8_ != local_1a8._0_8_) {
      pcVar18 = "GGUF";
      in_RCX.file = (FILE *)(FILE *)0x1;
      pFVar20 = (FILE *)0x0;
      do {
        pFVar23 = (FILE *)in_RCX.file;
        if (*(char *)((long)&pFVar20->_flags + (long)(int *)local_1a8._0_8_) !=
            *(char *)((long)&pFVar20[0x199c]._chain + 3)) {
          gguf_init_from_file_impl();
          return (gguf_context *)0x0;
        }
        in_RCX.file = (FILE *)(ulong)((int)pFVar23 + 1);
        pFVar20 = pFVar23;
      } while (pFVar23 < (FILE *)(local_1a8._8_8_ - local_1a8._0_8_));
    }
    if ((FILE *)local_1a8._0_8_ != (FILE *)0x0) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
      pcVar18 = (char *)extraout_RDX_00;
    }
    uVar10 = 0;
    local_1c0 = (FILE *)0x0;
    local_1c8 = (FILE *)0x0;
    if (bVar5) {
      in_RCX.file = local_210.file;
      sVar9 = fread(pgVar8,1,4,(FILE *)local_210.file);
      pcVar18 = (char *)extraout_RDX_01;
      if (sVar9 == 4) {
        uVar10 = (ulong)bVar5;
        if (pgVar8->version == 1) {
          gguf_init_from_file_impl();
          pcVar18 = (char *)extraout_RDX_29;
          uVar10 = 0;
        }
        in_RCX.file = (FILE *)(ulong)pgVar8->version;
        if (3 < pgVar8->version) {
          uVar10 = 0;
          fprintf(_stderr,
                  "%s: this GGUF file is version %u but this software only supports up to version %d\n"
                  ,"gguf_init_from_file_impl",in_RCX.file,3);
          pcVar18 = (char *)extraout_RDX_02;
        }
      }
      else {
        uVar10 = 0;
      }
    }
    if (((char)uVar10 == '\0') ||
       (in_RCX.file = local_210.file, sVar9 = fread(&local_1c8,1,8,(FILE *)local_210.file),
       pcVar18 = (char *)extraout_RDX_03, sVar9 != 8)) {
      uVar10 = 0;
    }
    else {
      in_RCX.file = (FILE *)local_1c8;
      if ((FILE *)0xbe82fa0be82fa0 < local_1c8) {
        uVar10 = 0;
        fprintf(_stderr,"%s: number of tensors is %li but must be in [0, %zu]\n",
                "gguf_init_from_file_impl");
        pcVar18 = (char *)extraout_RDX_04;
      }
    }
    if (((char)uVar10 == '\0') ||
       (in_RCX.file = local_210.file, sVar9 = fread(&local_1c0,1,8,(FILE *)local_210.file),
       pcVar18 = (char *)extraout_RDX_05, sVar9 != 8)) {
      uVar10 = 0;
    }
    else {
      in_RCX.file = (FILE *)local_1c0;
      if ((FILE *)0x2e8ba2e8ba2e8ba < local_1c0) {
        uVar10 = 0;
        fprintf(_stderr,"%s: number of key value pairs is %li but must be in [0, %zu]\n",
                "gguf_init_from_file_impl");
        pcVar18 = (char *)extraout_RDX_06;
      }
    }
    local_208 = (FILE *)&pgVar8->kv;
    bVar5 = (char)uVar10 == '\0';
    if (bVar5) {
      gguf_init_from_file_impl();
    }
    else {
      local_1d8 = pgVar8;
      local_1cc = uVar26;
      local_1b0 = ppgVar17;
      if ((!bVar5) && (0 < (long)local_1c0)) {
        lVar22 = 0;
        do {
          local_1a8._0_8_ = local_1a8 + 0x10;
          local_1a8._8_8_ = (FILE *)0x0;
          local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
          in_stack_fffffffffffffe08 = 1;
          in_stack_fffffffffffffe0c = 0;
          uVar10 = gguf_reader::read(&local_210,(int)local_1a8,pcVar18,(size_t)in_RCX.file);
          uVar10 = uVar10 & 0xffffffff;
          if ((char)uVar10 == '\0') {
            bVar5 = false;
            pcVar18 = (char *)extraout_RDX_07;
          }
          else {
            lVar19 = 8;
            pFVar20 = (FILE *)0x0;
            do {
              pgVar1 = (pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                       super__Vector_impl_data._M_start;
              in_RCX.file = (FILE *)(((long)(pgVar8->kv).
                                            super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pgVar1
                                     >> 3) * 0x2e8ba2e8ba2e8ba3);
              if (in_RCX.file <= pFVar20) {
                in_stack_fffffffffffffe04 = 0xffffffff;
                gVar15.file = local_210.file;
                sVar9 = fread(&stack0xfffffffffffffe04,1,4,(FILE *)local_210.file);
                bVar5 = sVar9 == 4;
                uVar26 = 0xffffffff;
                if (bVar5) {
                  uVar26 = in_stack_fffffffffffffe04;
                }
                bVar25 = uVar26 == 9;
                in_RCX.file = (FILE *)CONCAT71((int7)((ulong)gVar15.file >> 8),bVar25 && bVar5);
                if (bVar25 && bVar5) {
                  in_stack_fffffffffffffe04 = 0xffffffff;
                  in_RCX.file = local_210.file;
                  sVar9 = fread(&stack0xfffffffffffffe04,1,4,(FILE *)local_210.file);
                  uVar10 = 0;
                  if (sVar9 == 4) {
                    uVar26 = in_stack_fffffffffffffe04;
                  }
                  uVar28 = (ulong)uVar26;
                  pcVar18 = (char *)extraout_RDX_11;
                  if (sVar9 == 4) {
                    in_RCX.file = local_210.file;
                    sVar9 = fread(&stack0xfffffffffffffe08,1,8,(FILE *)local_210.file);
                    uVar10 = (ulong)(sVar9 == 8);
                    pcVar18 = (char *)extraout_RDX_12;
                  }
                }
                else {
                  uVar10 = (ulong)(bVar5 && !bVar25);
                  uVar28 = (ulong)uVar26;
                  pcVar18 = (char *)extraout_RDX_10;
                }
                if ((char)uVar10 != '\0') {
                  if ((uint)uVar28 < 0xd) {
                    pgVar8 = (gguf_context *)
                             (*(code *)(&DAT_00159a88 + *(int *)(&DAT_00159a88 + uVar28 * 4)))();
                    return pgVar8;
                  }
                  uVar10 = 0;
                  in_RCX.file = (FILE *)local_1a8._0_8_;
                  fprintf(_stderr,"%s: key \'%s\' has invalid GGUF type %d\n",
                          "gguf_init_from_file_impl",local_1a8._0_8_,uVar28);
                  bVar5 = true;
                  pcVar18 = (char *)extraout_RDX_14;
                  goto LAB_0013c74a;
                }
                break;
              }
              pcVar18 = (char *)local_1a8._8_8_;
              if (((FILE *)local_1a8._8_8_ ==
                   *(FILE **)((long)&(pgVar1->key)._M_dataplus._M_p + lVar19)) &&
                 (((FILE *)local_1a8._8_8_ == (FILE *)0x0 ||
                  (iVar6 = bcmp((void *)local_1a8._0_8_,*(void **)((long)pgVar1 + lVar19 + -8),
                                local_1a8._8_8_), pcVar18 = (char *)extraout_RDX_08, iVar6 == 0))))
              {
                uVar10 = 0;
                in_RCX.file = (FILE *)local_1a8._0_8_;
                fprintf(_stderr,"%s: duplicate key \'%s\' for tensors %zu and %li \n",
                        "gguf_init_from_file_impl",local_1a8._0_8_,pFVar20,lVar22);
                pcVar18 = (char *)extraout_RDX_09;
              }
              pFVar20 = (FILE *)((long)&pFVar20->_flags + 1);
              lVar19 = lVar19 + 0x58;
            } while ((uVar10 & 1) != 0);
            bVar5 = false;
          }
LAB_0013c74a:
          if ((FILE *)local_1a8._0_8_ != (FILE *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
            pcVar18 = (char *)extraout_RDX_13;
          }
        } while (((bVar5) && ((uVar10 & 1) != 0)) && (lVar22 = lVar22 + 1, lVar22 < (long)local_1c0)
                );
      }
      if ((uVar10 & 1) == 0) {
        gguf_init_from_file_impl();
      }
      else {
        if (((long)(pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pgVar8->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - (long)local_1c0 !=
            0) {
          pcVar18 = "int64_t(ctx->kv.size()) == n_kv";
          iVar6 = 0x1c7;
LAB_0013d2ee:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                     ,iVar6,"GGML_ASSERT(%s) failed",pcVar18);
        }
        iVar11 = gguf_find_key(pgVar8,"general.alignment");
        gVar15.file = (FILE *)0x20;
        if ((int)iVar11 != -1) {
          uVar7 = gguf_get_val_u32(pgVar8,(long)(int)iVar11);
          gVar15.file = (FILE *)(ulong)uVar7;
        }
        pgVar8->alignment = (size_t)gVar15.file;
        __buf = (undefined1 *)
                ((ulong)gVar15.file ^ (ulong)(((FILE *)gVar15.file)[-1]._unused2 + 0x13));
        if (((FILE *)gVar15.file)[-1]._unused2 + 0x13 < __buf) {
          pcVar18 = (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
          if (((uVar10 & 1) != 0) &&
             (pcVar18 = (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             0 < (long)local_1c8)) {
            local_208 = (FILE *)&pgVar8->info;
            pFVar20 = (FILE *)0x0;
            do {
              pcVar18 = &local_1e8;
              uVar28 = 0;
              local_1e8 = '\0';
              uVar10 = gguf_reader::read(&local_210,(int)&stack0xfffffffffffffe08,__buf,
                                         (size_t)gVar15.file);
              uVar10 = uVar10 & 0xffffffff;
              in_stack_fffffffffffffe10 = uVar28;
              if (uVar28 < 0x40) {
                ggml_set_name((ggml_tensor *)local_1a8,pcVar18);
                iVar6 = 0;
                __buf = extraout_RDX_15;
                if ((pFVar20 != (FILE *)0x0 & (byte)uVar10) == 1) {
                  __s2 = (((pgVar8->info).
                           super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                           _M_impl.super__Vector_impl_data._M_start)->t).name;
                  pFVar23 = (FILE *)0x0;
                  do {
                    iVar6 = strcmp(&stack0xffffffffffffff58,__s2);
                    if (iVar6 == 0) {
                      gVar15.file = (FILE *)&stack0xffffffffffffff58;
                      iVar6 = 0;
                      fprintf(_stderr,"%s: duplicate tensor name \'%s\' for tensors %li and %li\n",
                              "gguf_init_from_file_impl",gVar15.file,pFVar23,pFVar20);
                      uVar10 = 0;
                      __buf = extraout_RDX_22;
                      goto LAB_0013c97a;
                    }
                    if ((byte)uVar10 == 0) break;
                    pFVar23 = (FILE *)((long)&pFVar23->_flags + 1);
                    __s2 = __s2 + 0x158;
                  } while (pFVar23 < pFVar20);
                  iVar6 = 0;
                  __buf = extraout_RDX_16;
                }
              }
              else {
                uVar10 = 0;
                gVar15.file = (FILE *)pFVar20;
                fprintf(_stderr,"%s: tensor name %li is too long: %zu >= %d\n",
                        "gguf_init_from_file_impl",pFVar20,uVar28,0x40);
                iVar6 = 0xc;
                __buf = extraout_RDX_21;
              }
LAB_0013c97a:
              if (pcVar18 != &local_1e8) {
                operator_delete(pcVar18,CONCAT71(uStack_1e7,local_1e8) + 1);
                __buf = extraout_RDX_17;
              }
              uVar27 = (undefined4)((ulong)pcVar18 >> 0x20);
              if ((uVar28 < 0x40) && (iVar6 = 0xc, (char)uVar10 != '\0')) {
                uVar26 = 0xffffffff;
                sVar9 = fread(&stack0xfffffffffffffe08,1,4,(FILE *)local_210.file);
                uVar28 = (ulong)uVar26;
                if (uVar28 < 5) {
                  uVar10 = (ulong)(sVar9 == 4);
                  __buf = extraout_RDX_18;
                  if (sVar9 == 4) {
                    __ptr = (long *)(local_1a8 + 0x10);
                    uVar24 = 0;
                    do {
                      *__ptr = 1;
                      if (uVar24 < uVar28) {
                        sVar9 = fread(__ptr,1,8,(FILE *)local_210.file);
                        uVar10 = (ulong)(sVar9 == 8);
                        __buf = extraout_RDX_19;
                      }
                      if (*__ptr < 0) {
                        uVar10 = 0;
                        fprintf(_stderr,
                                "%s: tensor \'%s\' dimension %u has invalid number of elements: %li < 0\n"
                                ,"gguf_init_from_file_impl",&stack0xffffffffffffff58,
                                uVar24 & 0xffffffff);
                        __buf = extraout_RDX_25;
                        break;
                      }
                      if (2 < uVar24) break;
                      uVar24 = uVar24 + 1;
                      __ptr = __ptr + 1;
                    } while ((char)uVar10 != '\0');
                  }
                  gVar15.file = (FILE *)0x0;
                  bVar5 = true;
                  if ((char)uVar10 != '\0') {
                    if ((long)local_1a8._16_8_ <
                        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                               SEXT816((long)local_190),0)) {
                      if (local_1a8._16_8_ * (long)local_190 <
                          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                                 SEXT816(CONCAT44(uStack_184,local_188)),0)) {
                        auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
                        __buf = SUB168(auVar2 % SEXT816(CONCAT44(uStack_17c,uStack_180)),0);
                        gVar15.file = (FILE *)0x0;
                        if (CONCAT44(uStack_184,local_188) * local_1a8._16_8_ * (long)local_190 <
                            SUB168(auVar2 / SEXT816(CONCAT44(uStack_17c,uStack_180)),0))
                        goto LAB_0013cbbd;
                      }
                    }
                    fprintf(_stderr,
                            "%s: total number of elements in tensor \'%s\' with shape (%li, %li, %li, %li) is >= %li\n"
                            ,"gguf_init_from_file_impl",&stack0xffffffffffffff58,local_1a8._16_8_,
                            local_190,CONCAT44(uStack_184,local_188),CONCAT44(uStack_17c,uStack_180)
                            ,0x7fffffffffffffff);
                    __buf = extraout_RDX_20;
                    goto LAB_0013cbb5;
                  }
                }
                else {
                  fprintf(_stderr,"%s: tensor \'%s\' has invalid number of dimensions: %u > %u\n",
                          "gguf_init_from_file_impl",&stack0xffffffffffffff58,(ulong)uVar26,4);
                  __buf = extraout_RDX_23;
LAB_0013cbb5:
                  bVar5 = false;
                  gVar15.file = (FILE *)0xc;
                  uVar10 = 0;
                }
LAB_0013cbbd:
                pcVar18 = (char *)CONCAT44(uVar27,uVar26);
                if (bVar5) {
                  if (uVar10 != 0) {
                    uVar26 = 0xffffffff;
                    sVar9 = fread(&stack0xfffffffffffffe08,1,4,(FILE *)local_210.file);
                    pFVar23 = _stderr;
                    if (sVar9 == 4) {
                      local_1a8._0_4_ = uVar26;
                    }
                    uVar4 = local_1a8._0_8_;
                    uVar10 = (ulong)(sVar9 == 4);
                    if ((uint)local_1a8._0_4_ < GGML_TYPE_COUNT) {
                      sVar12 = ggml_type_size(local_1a8._0_4_);
                      iVar11 = ggml_blck_size(local_1a8._0_4_);
                      uVar4 = local_1a8._0_8_;
                      pFVar23 = _stderr;
                      if ((iVar11 == 0) || ((long)local_1a8._16_8_ % iVar11 != 0)) {
                        pcVar18 = ggml_type_name(local_1a8._0_4_);
                        bVar5 = false;
                        gVar15.file = (FILE *)&stack0xffffffffffffff58;
                        fprintf(pFVar23,
                                "%s: tensor \'%s\' of type %d (%s) has %ld elements per row, not a multiple of block size (%ld)\n"
                                ,"gguf_init_from_file_impl",gVar15.file,uVar4 & 0xffffffff,pcVar18,
                                local_1a8._16_8_,iVar11);
                        iVar6 = 0xc;
                        uVar10 = 0;
                        __buf = extraout_RDX_26;
                      }
                      else {
                        local_178 = sVar12;
                        sVar12 = ((long)local_1a8._16_8_ / iVar11) * sVar12;
                        local_170 = sVar12;
                        lVar22 = 0;
                        do {
                          sVar12 = sVar12 * (long)(&local_190)[lVar22];
                          asStack_168[lVar22] = sVar12;
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 2);
                        iVar6 = 0;
                        bVar5 = true;
                        __buf = (undefined1 *)0x0;
                        gVar15.file = (FILE *)0x2;
                      }
                      pgVar8 = local_1d8;
                      pcVar18 = (char *)CONCAT44(uVar27,uVar26);
                      if ((bVar5) &&
                         (iVar6 = 0xc, pcVar18 = (char *)CONCAT44(uVar27,uVar26),
                         (char)uVar10 != '\0')) {
                        gVar15.file = local_210.file;
                        sVar9 = fread(&stack0xffffffffffffffa8,1,8,(FILE *)local_210.file);
                        uVar10 = (ulong)(sVar9 == 8);
                        __position._M_current =
                             (pgVar8->info).
                             super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (__position._M_current ==
                            (pgVar8->info).
                            super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<gguf_tensor_info,std::allocator<gguf_tensor_info>>::
                          _M_realloc_insert<gguf_tensor_info_const&>
                                    ((vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *)
                                     local_208,__position,(gguf_tensor_info *)local_1a8);
                          __buf = extraout_RDX_27;
                        }
                        else {
                          memcpy(__position._M_current,local_1a8,0x158);
                          (pgVar8->info).
                          super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                          __buf = extraout_RDX_24;
                        }
                        pcVar18 = (char *)CONCAT44(uVar27,uVar26);
                        iVar6 = 0;
                      }
                      goto LAB_0013cdf9;
                    }
                    pcVar18 = ggml_type_name(local_1a8._0_4_);
                    uVar10 = 0;
                    gVar15.file = (FILE *)&stack0xffffffffffffff58;
                    fprintf(pFVar23,"%s: tensor \'%s\' has invalid ggml type %d (%s)\n",
                            "gguf_init_from_file_impl",gVar15.file,uVar4 & 0xffffffff,pcVar18);
                    __buf = extraout_RDX_28;
                  }
                  pcVar18 = (char *)CONCAT44(uVar27,uVar26);
                  iVar6 = 0xc;
                }
                else {
                  iVar6 = (int)gVar15.file;
                }
              }
LAB_0013cdf9:
            } while (((iVar6 == 0) && ((uVar10 & 1) != 0)) &&
                    (pFVar20 = (FILE *)((long)&pFVar20->_flags + 1), (long)pFVar20 < (long)local_1c8
                    ));
          }
          pgVar14 = local_1b8;
          pFVar20 = local_1c8;
          if ((uVar10 & 1) == 0) {
            gguf_init_from_file_impl();
          }
          else {
            if (((long)(pgVar8->info).
                       super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pgVar8->info).
                       super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d -
                (long)local_1c8 != 0) {
              pcVar18 = "int64_t(ctx->info.size()) == n_tensors";
              iVar6 = 0x24d;
              goto LAB_0013d2ee;
            }
            lVar22 = ftell((FILE *)local_1b8);
            iVar6 = fseek((FILE *)pgVar14,-pgVar8->alignment & (lVar22 + pgVar8->alignment) - 1,0);
            if (iVar6 == 0) {
              local_208 = pFVar20;
              sVar12 = ftell((FILE *)pgVar14);
              pgVar8->offset = sVar12;
              pgVar8->size = 0;
              pgVar16 = (pgVar8->info).
                        super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((pgVar8->info).
                  super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                  super__Vector_impl_data._M_finish != pgVar16) {
                lVar22 = 0x100;
                uVar28 = 0;
                do {
                  sVar12 = *(size_t *)((long)(pgVar16->t).op_params + lVar22 + -4);
                  if (sVar12 != pgVar8->size) {
                    fprintf(_stderr,"%s: tensor \'%s\' has offset %lu, expected %zu\n",
                            "gguf_init_from_file_impl",(long)(pgVar16->t).ne + lVar22 + -0x10,sVar12
                            ,pgVar8->size);
                    fprintf(_stderr,"%s: failed to read tensor data\n","gguf_init_from_file_impl");
                    gguf_free(pgVar8);
                    return (gguf_context *)0x0;
                  }
                  sVar12 = ggml_nbytes((ggml_tensor *)((long)pgVar16 + lVar22 + -0x100));
                  pgVar8->size = pgVar8->size +
                                 (-pgVar8->alignment & (sVar12 + pgVar8->alignment) - 1);
                  uVar28 = uVar28 + 1;
                  pgVar16 = (pgVar8->info).
                            super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  lVar22 = lVar22 + 0x158;
                } while (uVar28 < (ulong)(((long)(pgVar8->info).
                                                 super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pgVar16 >> 3) * -0x7d05f417d05f417d));
              }
              ppgVar17 = local_1b0;
              uVar26 = local_1cc;
              if (local_1b0 == (ggml_context **)0x0) {
                return pgVar8;
              }
              bVar21 = (byte)local_1cc;
              if ((local_1cc & 1) == 0) {
                piVar3 = &local_208->_flags;
                sVar12 = ggml_tensor_overhead();
                local_48 = (_IO_marker *)(sVar12 * (long)((long)piVar3 + 1) + pgVar8->size);
              }
              else {
                sVar12 = ggml_tensor_overhead();
                local_48 = (_IO_marker *)(sVar12 * (long)local_208);
              }
              local_38 = bVar21 & 1;
              p_Stack_40 = (_IO_FILE *)0x0;
              params_00.mem_size._4_4_ = in_stack_fffffffffffffe04;
              params_00.mem_size._0_4_ = in_stack_fffffffffffffe00;
              params_00.mem_buffer._0_4_ = (int)pcVar18;
              params_00.mem_buffer._4_4_ = (int)((ulong)pcVar18 >> 0x20);
              params_00._16_8_ = in_stack_fffffffffffffe10;
              local_208 = (FILE *)ggml_init(params_00);
              *ppgVar17 = (ggml_context *)local_208;
              if (local_208 != (FILE *)0x0) {
                if ((uVar26 & 1) == 0) {
                  pgVar14 = ggml_new_tensor_1d((ggml_context *)local_208,GGML_TYPE_I8,pgVar8->size);
                  if (pgVar14 == (ggml_tensor *)0x0) {
                    uVar10 = 0;
                  }
                  else {
                    ggml_set_name(pgVar14,"GGUF tensor data binary blob");
                    sVar9 = pgVar8->size;
                    sVar13 = fread(pgVar14->data,1,sVar9,(FILE *)local_210.file);
                    uVar10 = (ulong)(sVar13 == sVar9);
                  }
                  if ((char)uVar10 == '\0') {
                    gguf_init_from_file_impl();
                    return (gguf_context *)0x0;
                  }
                  pgVar8->data = pgVar14->data;
                }
                else {
                  pgVar14 = (ggml_tensor *)0x0;
                }
                ggml_set_no_alloc((ggml_context *)local_208,true);
                pgVar16 = (pgVar8->info).
                          super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((pgVar8->info).
                    super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                    super__Vector_impl_data._M_finish == pgVar16) {
LAB_0013d1e2:
                  if ((uVar10 & 1) == 0) {
                    gguf_init_from_file_impl();
                    return (gguf_context *)0x0;
                  }
                }
                else {
                  lVar22 = 0x100;
                  uVar28 = 0;
                  local_1b8 = pgVar14;
                  do {
                    pgVar14 = ggml_new_tensor((ggml_context *)local_208,
                                              *(ggml_type *)((long)pgVar16 + lVar22 + -0x100),4,
                                              (int64_t *)((long)pgVar16 + lVar22 + -0xf0));
                    bVar21 = pgVar14 != (ggml_tensor *)0x0 & (byte)uVar10;
                    uVar10 = (ulong)bVar21;
                    if (bVar21 != 1) goto LAB_0013d1e2;
                    ggml_set_name(pgVar14,(char *)((long)(pgVar16->t).ne + lVar22 + -0x10));
                    if ((local_1cc & 1) == 0) {
                      pgVar14->data =
                           (void *)((long)local_1b8->data +
                                   *(long *)((long)(pgVar16->t).op_params + lVar22 + -4));
                    }
                    uVar28 = uVar28 + 1;
                    pgVar16 = (local_1d8->info).
                              super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar22 = lVar22 + 0x158;
                    uVar10 = 1;
                  } while (uVar28 < (ulong)(((long)(local_1d8->info).
                                                                                                      
                                                  super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pgVar16 >> 3) * -0x7d05f417d05f417d));
                }
                ggml_set_no_alloc((ggml_context *)local_208,(_Bool)((byte)local_1cc & 1));
                return local_1d8;
              }
              gguf_init_from_file_impl();
            }
            else {
              gguf_init_from_file_impl();
            }
          }
        }
        else {
          fprintf(_stderr,"%s: alignment %zu is not a power of 2\n","gguf_init_from_file_impl");
          gguf_free(pgVar8);
        }
      }
    }
  }
  else {
    gguf_init_from_file_impl();
  }
  return (gguf_context *)0x0;
}

Assistant:

struct gguf_context * gguf_init_from_file_impl(FILE * file, struct gguf_init_params params) {
    const struct gguf_reader gr(file);
    struct gguf_context * ctx = new gguf_context;

    bool ok = true;

    // file magic
    {
        std::vector<char> magic;
        ok = ok && gr.read(magic, 4);

        if (!ok) {
            fprintf(stderr, "%s: failed to read magic\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        for (uint32_t i = 0; i < magic.size(); i++) {
            if (magic[i] != GGUF_MAGIC[i]) {
                fprintf(stderr, "%s: invalid magic characters: '%c%c%c%c', expected 'GGUF'\n", __func__, magic[0], magic[1], magic[2], magic[3]);
                gguf_free(ctx);
                return nullptr;
            }
        }
    }

    // header
    int64_t n_kv      = 0;
    int64_t n_tensors = 0;

    if (ok && gr.read(ctx->version)) {
        if (ctx->version == 1) {
            fprintf(stderr, "%s: GGUFv1 is no longer supported, please use a more up-to-date version\n", __func__);
            ok = false;
        }
        if (ctx->version > GGUF_VERSION) {
            fprintf(stderr, "%s: this GGUF file is version %" PRIu32 " but this software only supports up to version %d\n",
                __func__, ctx->version, GGUF_VERSION);
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_tensors)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_tensors < 0 || n_tensors > int64_t(SIZE_MAX/sizeof(gguf_tensor_info))) {
            fprintf(stderr, "%s: number of tensors is %" PRIi64 " but must be in [0, %zu]\n",
                __func__, n_tensors, SIZE_MAX/sizeof(gguf_tensor_info));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_kv)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_kv < 0 || n_kv > int64_t(SIZE_MAX/sizeof(gguf_kv))) {
            fprintf(stderr, "%s: number of key value pairs is %" PRIi64 " but must be in [0, %zu]\n",
                    __func__, n_kv, SIZE_MAX/sizeof(gguf_kv));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read header\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // KV pairs
    {
        for (int64_t i = 0; ok && i < n_kv; ++i) {
            std::string key;
            gguf_type   type     = gguf_type(-1);
            bool        is_array = false;
            uint64_t    n        = 1;

            try {
                ok = ok && gr.read(key);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            for (size_t j = 0; ok && j < ctx->kv.size(); ++j) {
                if (key == ctx->kv[j].key) {
                    fprintf(stderr, "%s: duplicate key '%s' for tensors %zu and %" PRIi64 " \n", __func__, key.c_str(), j, i);
                    ok = false;
                }
            }
            if (!ok) {
                break;
            }

            ok = ok && gr.read(type);
            if (type == GGUF_TYPE_ARRAY) {
                is_array = true;
                ok = ok && gr.read(type);
                ok = ok && gr.read(n);
            }
            if (!ok) {
                break;
            }

            switch (type) {
                case GGUF_TYPE_UINT8:   ok = ok && gguf_read_emplace_helper<uint8_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT8:    ok = ok && gguf_read_emplace_helper<int8_t>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT16:  ok = ok && gguf_read_emplace_helper<uint16_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT16:   ok = ok && gguf_read_emplace_helper<int16_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT32:  ok = ok && gguf_read_emplace_helper<uint32_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT32:   ok = ok && gguf_read_emplace_helper<int32_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT32: ok = ok && gguf_read_emplace_helper<float>      (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_BOOL:    ok = ok && gguf_read_emplace_helper<bool>       (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_STRING:  ok = ok && gguf_read_emplace_helper<std::string>(gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT64:  ok = ok && gguf_read_emplace_helper<uint64_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT64:   ok = ok && gguf_read_emplace_helper<int64_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT64: ok = ok && gguf_read_emplace_helper<double>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_ARRAY:
                default:
                    {
                        fprintf(stderr, "%s: key '%s' has invalid GGUF type %d\n", __func__, key.c_str(), type);
                        ok = false;
                    } break;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to read key-value pairs\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }
        GGML_ASSERT(int64_t(ctx->kv.size()) == n_kv);

        const int alignment_idx = gguf_find_key(ctx, GGUF_KEY_GENERAL_ALIGNMENT);
        ctx->alignment = alignment_idx == -1 ? GGUF_DEFAULT_ALIGNMENT : gguf_get_val_u32(ctx, alignment_idx);

        if (ctx->alignment == 0 || (ctx->alignment & (ctx->alignment - 1)) != 0) {
            fprintf(stderr, "%s: alignment %zu is not a power of 2\n", __func__, ctx->alignment);
            gguf_free(ctx);
            return nullptr;
        }
    }

    // read the tensor info
    for (int64_t i = 0; ok && i < n_tensors; ++i) {
        struct gguf_tensor_info info;

        // tensor name
        {
            std::string name;
            try {
                ok = ok && gr.read(name);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            if (name.length() >= GGML_MAX_NAME) {
                fprintf(stderr, "%s: tensor name %" PRIi64 " is too long: %zu >= %d\n", __func__, i, name.length(), GGML_MAX_NAME);
                ok = false;
                break;
            }
            ggml_set_name(&info.t, name.c_str());

            // make sure there are no duplicate tensor names
            for (int64_t j = 0; ok && j < i; ++j) {
                if (strcmp(info.t.name, ctx->info[j].t.name) == 0) {
                    fprintf(stderr, "%s: duplicate tensor name '%s' for tensors %" PRIi64 " and %" PRIi64 "\n", __func__, info.t.name, j, i);
                    ok = false;
                    break;
                }
            }
        }
        if (!ok) {
            break;
        }

        // tensor shape
        {
            uint32_t n_dims = -1;
            ok = ok && gr.read(n_dims);
            if (n_dims > GGML_MAX_DIMS) {
                fprintf(stderr, "%s: tensor '%s' has invalid number of dimensions: %" PRIu32 " > %" PRIu32 "\n",
                    __func__, info.t.name, n_dims, GGML_MAX_DIMS);
                ok = false;
                break;
            }
            for (uint32_t j = 0; ok && j < GGML_MAX_DIMS; ++j) {
                info.t.ne[j] = 1;
                if (j < n_dims) {
                    ok = ok && gr.read(info.t.ne[j]);
                }

                // check that all ne are non-negative
                if (info.t.ne[j] < 0) {
                    fprintf(stderr, "%s: tensor '%s' dimension %" PRIu32 " has invalid number of elements: %" PRIi64 " < 0\n",
                        __func__, info.t.name, j, info.t.ne[j]);
                    ok = false;
                    break;
                }
            }

            // check that the total number of elements is representable
            if (ok && ((INT64_MAX/info.t.ne[1] <= info.t.ne[0]) ||
                       (INT64_MAX/info.t.ne[2] <= info.t.ne[0]*info.t.ne[1]) ||
                       (INT64_MAX/info.t.ne[3] <= info.t.ne[0]*info.t.ne[1]*info.t.ne[2]))) {

                fprintf(stderr, "%s: total number of elements in tensor '%s' with shape "
                    "(%" PRIi64 ", %" PRIi64 ", %" PRIi64 ", %" PRIi64 ") is >= %" PRIi64 "\n",
                    __func__, info.t.name, info.t.ne[0], info.t.ne[1], info.t.ne[2], info.t.ne[3], INT64_MAX);
                ok = false;
                break;
            }
        }
        if (!ok) {
            break;
        }

        // tensor type
        {
            ok = ok && gr.read(info.t.type);

            // check that tensor type is within defined range
            if (info.t.type < 0 || info.t.type >= GGML_TYPE_COUNT) {
                fprintf(stderr, "%s: tensor '%s' has invalid ggml type %d (%s)\n",
                    __func__, info.t.name, info.t.type, ggml_type_name(info.t.type));
                ok = false;
                break;
            }
            const size_t  type_size = ggml_type_size(info.t.type);
            const int64_t blck_size = ggml_blck_size(info.t.type);

            // check that row size is divisible by block size
            if (blck_size == 0 || info.t.ne[0] % blck_size != 0) {
                fprintf(stderr, "%s: tensor '%s' of type %d (%s) has %" PRId64 " elements per row, "
                    "not a multiple of block size (%" PRId64 ")\n",
                    __func__, info.t.name, (int) info.t.type, ggml_type_name(info.t.type), info.t.ne[0], blck_size);
                ok = false;
                break;
            }

            // calculate byte offsets given the tensor shape and type
            info.t.nb[0] = type_size;
            info.t.nb[1] = info.t.nb[0]*(info.t.ne[0]/blck_size);
            for (int j = 2; j < GGML_MAX_DIMS; ++j) {
                info.t.nb[j] = info.t.nb[j - 1]*info.t.ne[j - 1];
            }
        }
        if (!ok) {
            break;
        }

        // tensor data offset within buffer
        ok = ok && gr.read(info.offset);

        ctx->info.push_back(info);
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read tensor info\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }
    GGML_ASSERT(int64_t(ctx->info.size()) == n_tensors);

    // we require the data section to be aligned, so take into account any padding
    if (fseek(file, GGML_PAD(ftell(file), ctx->alignment), SEEK_SET) != 0) {
        fprintf(stderr, "%s: failed to seek to beginning of data section\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // store the current file offset - this is where the data section starts
    ctx->offset = ftell(file);

    // compute the total size of the data section, taking into account the alignment
    {
        ctx->size = 0;
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const gguf_tensor_info & ti = ctx->info[i];
            if (ti.offset != ctx->size) {
                fprintf(stderr, "%s: tensor '%s' has offset %" PRIu64 ", expected %zu\n",
                    __func__, ti.t.name, ti.offset, ctx->size);
                fprintf(stderr, "%s: failed to read tensor data\n", __func__);
                gguf_free(ctx);
                return nullptr;
            }
            ctx->size += GGML_PAD(ggml_nbytes(&ti.t), ctx->alignment);
        }
    }

    // load the tensor data only if requested
    if (params.ctx != nullptr) {
        // if the provided gguf_context is no_alloc, then we create "empty" tensors and do not read the binary blob
        // otherwise, we load the binary blob into the created ggml_context as well, and point the "data" members of
        //   the ggml_tensor structs to the appropriate locations in the binary blob

        // compute the exact size needed for the new ggml_context
        const size_t mem_size =
            params.no_alloc ?
            (n_tensors    )*ggml_tensor_overhead() :
            (n_tensors + 1)*ggml_tensor_overhead() + ctx->size;

        struct ggml_init_params pdata = {
            /*mem_size   =*/ mem_size,
            /*mem_buffer =*/ nullptr,
            /*no_alloc   =*/ params.no_alloc,
        };

        *params.ctx = ggml_init(pdata);
        if (*params.ctx == nullptr) {
            fprintf(stderr, "%s: failed to initialize ggml context for storing tensors\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        struct ggml_context * ctx_data = *params.ctx;

        struct ggml_tensor * data = nullptr;

        if (!params.no_alloc) {
            data = ggml_new_tensor_1d(ctx_data, GGML_TYPE_I8, ctx->size);

            ok = ok && data != nullptr;

            if (ok) {
                ggml_set_name(data, "GGUF tensor data binary blob");
            }

            // read the binary blob with the tensor data
            ok = ok && gr.read(data->data, ctx->size);

            if (!ok) {
                fprintf(stderr, "%s: failed to read tensor data binary blob\n", __func__);
                ggml_free(ctx_data);
                *params.ctx = nullptr;
                gguf_free(ctx);
                return nullptr;
            }

            ctx->data = data->data;
        }

        ggml_set_no_alloc(ctx_data, true);

        // create the tensors
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const struct gguf_tensor_info & info = ctx->info[i];

            struct ggml_tensor * cur = ggml_new_tensor(ctx_data, info.t.type, GGML_MAX_DIMS, info.t.ne);

            ok = ok && cur != nullptr;

            if (!ok) {
                break;
            }

            ggml_set_name(cur, info.t.name);

            // point the data member to the appropriate location in the binary blob using the tensor info
            if (!params.no_alloc) {
                cur->data = (char *) data->data + info.offset;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to create tensors\n", __func__);
            ggml_free(ctx_data);
            *params.ctx = nullptr;
            gguf_free(ctx);
            return nullptr;
        }

        ggml_set_no_alloc(ctx_data, params.no_alloc);
    }

    return ctx;
}